

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_4::PtexUtils::blend
               (void *src,float weight,void *dst,bool flip,int rowlen,DataType dt,int nchan)

{
  int in_ECX;
  byte in_DL;
  float *in_RSI;
  float *in_RDI;
  int in_R8D;
  int in_R9D;
  float in_XMM0_Da;
  undefined3 in_stack_ffffffffffffffe4;
  float weight_00;
  undefined4 in_stack_fffffffffffffff0;
  
  weight_00 = (float)((ulong)in_RSI >> 0x20);
  switch((uint)(in_DL & 1) + in_R8D * 2) {
  case 0:
    anon_unknown_1::blend<unsigned_char>((uchar *)in_RDI,in_XMM0_Da,(uchar *)in_RSI,in_ECX,in_R9D);
    break;
  case 1:
    anon_unknown_1::blendflip<unsigned_char>
              ((uchar *)in_RDI,in_XMM0_Da,(uchar *)in_RSI,in_ECX,in_R9D);
    break;
  case 2:
    anon_unknown_1::blend<unsigned_short>
              ((unsigned_short *)in_RDI,in_XMM0_Da,(unsigned_short *)in_RSI,in_ECX,in_R9D);
    break;
  case 3:
    anon_unknown_1::blendflip<unsigned_short>
              ((unsigned_short *)in_RDI,in_XMM0_Da,(unsigned_short *)in_RSI,in_ECX,in_R9D);
    break;
  case 4:
    anon_unknown_1::blend<Ptex::v2_4::PtexHalf>
              ((PtexHalf *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffff0),weight_00,
               (PtexHalf *)
               (CONCAT44(CONCAT13(in_DL,in_stack_ffffffffffffffe4),in_ECX) & 0x1ffffffffffffff),
               in_R8D,in_R9D);
    break;
  case 5:
    anon_unknown_1::blendflip<Ptex::v2_4::PtexHalf>
              ((PtexHalf *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffff0),weight_00,
               (PtexHalf *)
               (CONCAT44(CONCAT13(in_DL,in_stack_ffffffffffffffe4),in_ECX) & 0x1ffffffffffffff),
               in_R8D,in_R9D);
    break;
  case 6:
    anon_unknown_1::blend<float>(in_RDI,in_XMM0_Da,in_RSI,in_ECX,in_R9D);
    break;
  case 7:
    anon_unknown_1::blendflip<float>(in_RDI,in_XMM0_Da,in_RSI,in_ECX,in_R9D);
  }
  return;
}

Assistant:

void blend(const void* src, float weight, void* dst, bool flip,
           int rowlen, DataType dt, int nchan)
{
    switch ((dt<<1) | int(flip)) {
    case (dt_uint8<<1):        blend(static_cast<const uint8_t*>(src), weight,
                                     static_cast<uint8_t*>(dst), rowlen, nchan); break;
    case (dt_uint8<<1 | 1):    blendflip(static_cast<const uint8_t*>(src), weight,
                                         static_cast<uint8_t*>(dst), rowlen, nchan); break;
    case (dt_half<<1):         blend(static_cast<const PtexHalf*>(src), weight,
                                     static_cast<PtexHalf*>(dst), rowlen, nchan); break;
    case (dt_half<<1 | 1):     blendflip(static_cast<const PtexHalf*>(src), weight,
                                         static_cast<PtexHalf*>(dst), rowlen, nchan); break;
    case (dt_uint16<<1):       blend(static_cast<const uint16_t*>(src), weight,
                                     static_cast<uint16_t*>(dst), rowlen, nchan); break;
    case (dt_uint16<<1 | 1):   blendflip(static_cast<const uint16_t*>(src), weight,
                                         static_cast<uint16_t*>(dst), rowlen, nchan); break;
    case (dt_float<<1):        blend(static_cast<const float*>(src), weight,
                                     static_cast<float*>(dst), rowlen, nchan); break;
    case (dt_float<<1 | 1):    blendflip(static_cast<const float*>(src), weight,
                                         static_cast<float*>(dst), rowlen, nchan); break;
    }
}